

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O2

CURLSH * curl_share_init(void)

{
  int iVar1;
  CURLSH *pCVar2;
  
  pCVar2 = (CURLSH *)(*Curl_ccalloc)(1,200);
  if (pCVar2 != (CURLSH *)0x0) {
    *(byte *)&pCVar2->specifier = (byte)pCVar2->specifier | 2;
    iVar1 = Curl_mk_dnscache(&pCVar2->hostcache);
    if (iVar1 == 0) {
      return pCVar2;
    }
    (*Curl_cfree)(pCVar2);
  }
  return (CURLSH *)0x0;
}

Assistant:

struct Curl_share *
curl_share_init(void)
{
  struct Curl_share *share = calloc(1, sizeof(struct Curl_share));
  if(share) {
    share->specifier |= (1<<CURL_LOCK_DATA_SHARE);

    if(Curl_mk_dnscache(&share->hostcache)) {
      free(share);
      return NULL;
    }
  }

  return share;
}